

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
tinyusdz::Attribute::set_value<tinyusdz::value::matrix4d>(Attribute *this,matrix4d *v)

{
  long *local_40;
  undefined8 local_38;
  long local_30;
  undefined1 local_28;
  
  if ((this->_type_name)._M_string_length == 0) {
    local_30 = 0x643478697274616d;
    local_38 = 8;
    local_28 = 0;
    local_40 = &local_30;
    ::std::__cxx11::string::operator=((string *)&this->_type_name,(string *)&local_40);
    if (local_40 != &local_30) {
      operator_delete(local_40,local_30 + 1);
    }
  }
  linb::any::operator=((any *)&this->_var,v);
  return;
}

Assistant:

void set_value(const T &v) {
    if (_type_name.empty()) {
      _type_name = value::TypeTraits<T>::type_name();
    }
    _var.set_value(v);
  }